

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_AmrMesh.cpp
# Opt level: O0

void __thiscall
amrex::AmrMesh::AmrMesh
          (AmrMesh *this,RealBox *rb,int max_level_in,Vector<int,_std::allocator<int>_> *n_cell_in,
          int coord,Vector<amrex::IntVect,_std::allocator<amrex::IntVect>_> *a_refrat,int *is_per)

{
  undefined8 *in_RDI;
  AmrInfo *in_stack_00000050;
  int *in_stack_000000d0;
  int in_stack_000000dc;
  RealBox *in_stack_000000e0;
  int in_stack_000006f4;
  RealBox *in_stack_000006f8;
  Vector<amrex::IntVect,_std::allocator<amrex::IntVect>_> *in_stack_00000700;
  Vector<int,_std::allocator<int>_> *in_stack_00000708;
  int in_stack_00000714;
  AmrMesh *in_stack_00000718;
  int *in_stack_00000b60;
  Vector<amrex::IntVect,_std::allocator<amrex::IntVect>_> *in_stack_ffffffffffffff58;
  Vector<amrex::IntVect,_std::allocator<amrex::IntVect>_> *in_stack_ffffffffffffff60;
  
  AmrInfo::AmrInfo(in_stack_00000050);
  *in_RDI = &PTR__AmrMesh_01aa49b8;
  Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>::Vector
            ((Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_> *)0x1371d56);
  Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>::Vector
            ((Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_> *)
             0x1371d6c);
  Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>::Vector
            ((Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_> *)0x1371d82);
  *(undefined4 *)(in_RDI + 0x1c) = 0;
  *(undefined4 *)((long)in_RDI + 0xe4) = 0;
  Geometry::Setup(in_stack_000000e0,in_stack_000000dc,in_stack_000000d0);
  Vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>::Vector
            (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  InitAmrMesh(in_stack_00000718,in_stack_00000714,in_stack_00000708,in_stack_00000700,
              in_stack_000006f8,in_stack_000006f4,in_stack_00000b60);
  Vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>::~Vector
            ((Vector<amrex::IntVect,_std::allocator<amrex::IntVect>_> *)0x1371e25);
  return;
}

Assistant:

AmrMesh::AmrMesh (const RealBox* rb, int max_level_in,
                  const Vector<int>& n_cell_in, int coord,
                  Vector<IntVect> a_refrat, const int* is_per)
{
    Geometry::Setup(rb,coord,is_per);
    InitAmrMesh(max_level_in,n_cell_in, std::move(a_refrat), rb, coord, is_per);
}